

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cubbyhole.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Cubbyhole::list
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cubbyhole *this,Path *path)

{
  Client *client;
  Url local_38;
  
  client = *(Client **)this;
  getUrl(&local_38,this,path);
  HttpConsumer::list(__return_storage_ptr__,client,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value_._M_dataplus._M_p != &local_38.value_.field_2) {
    operator_delete(local_38.value_._M_dataplus._M_p,
                    local_38.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Cubbyhole::list(const Path &path) {
  return Vault::HttpConsumer::list(client_, getUrl(path));
}